

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrycollection.cpp
# Opt level: O1

Primitive * newPrimitive(Json *conf)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vec2f vVar4;
  vec3f vn2;
  vec3f vn3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  char cVar11;
  const_reference pvVar12;
  mapped_type *ppPVar13;
  Triangle *this;
  runtime_error *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  vec3f vVar14;
  vec3f v1;
  vec3f v2;
  vec3f v3;
  const_iterator result;
  float local_12c;
  double ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  vec2f local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"mesh");
  if (bVar10) {
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"file");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,pvVar12);
    ppPVar13 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(anonymous_namespace)::meshref_abi_cxx11_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ret);
    this = (Triangle *)*ppPVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(ret._1_7_,ret._0_1_) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(ret._1_7_,ret._0_1_),local_118._M_allocated_capacity + 1);
    }
  }
  else {
    this = (Triangle *)0x0;
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"sphere");
  if (bVar10) {
    this = (Triangle *)operator_new(0x18);
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"origin");
    vVar14 = json2vec3f(pvVar12);
    local_e8._8_4_ = extraout_XMM0_Dc;
    local_e8._0_8_ = vVar14._0_8_;
    local_e8._12_4_ = extraout_XMM0_Dd;
    local_f8._0_4_ = vVar14.z;
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"radius");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar12,&ret);
    auVar5 = local_e8._0_16_;
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016bda8;
    (this->v1).x = (float)local_e8._0_4_;
    (this->v1).y = (float)local_e8._4_4_;
    (this->v1).z = (float)local_f8._0_4_;
    (this->v2).x = (float)(double)CONCAT71(ret._1_7_,ret._0_1_);
    local_e8._0_16_ = auVar5;
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"plane");
  if (bVar10) {
    this = (Triangle *)operator_new(0x18);
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normal");
    vVar14 = json2vec3f(pvVar12);
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._0_8_ = vVar14._0_8_;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    local_f8._0_4_ = vVar14.z;
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"offset");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar12,&ret);
    auVar5 = local_e8._0_16_;
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016be08;
    (this->v1).x = (float)local_e8._0_4_;
    (this->v1).y = (float)local_e8._4_4_;
    (this->v1).z = (float)local_f8._0_4_;
    (this->v2).x = (float)(double)CONCAT71(ret._1_7_,ret._0_1_);
    local_e8._0_16_ = auVar5;
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"cube");
  if (bVar10) {
    this = (Triangle *)operator_new(8);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016be68;
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"quad");
  if (bVar10) {
    this = (Triangle *)operator_new(8);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016bea8;
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"revsurface");
  if (bVar10) {
    this = (Triangle *)operator_new(0x18);
    RevSurface::RevSurface((RevSurface *)this,conf);
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar10 = nlohmann::operator==<const_char_*,_0>(pvVar12,"triangle");
  if (bVar10) {
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar12 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar12,0);
    vVar14 = json2vec3f(pvVar12);
    local_fc = vVar14.z;
    local_38._8_4_ = extraout_XMM0_Dc_01;
    local_38._0_8_ = vVar14._0_8_;
    local_38._12_4_ = extraout_XMM0_Dd_01;
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar12 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar12,1);
    vVar14 = json2vec3f(pvVar12);
    local_100 = vVar14.z;
    local_48._8_4_ = extraout_XMM0_Dc_02;
    local_48._0_8_ = vVar14._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd_02;
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar12 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar12,2);
    vVar14 = json2vec3f(pvVar12);
    local_104 = vVar14.z;
    local_58._8_4_ = extraout_XMM0_Dc_03;
    local_58._0_8_ = vVar14._0_8_;
    local_58._12_4_ = extraout_XMM0_Dd_03;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[8]>
              ((const_iterator *)&ret,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [8])0x158b45);
    result.m_it.primitive_iterator.m_it = -0x8000000000000000;
    result.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    result.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      result.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      result.m_it.object_iterator._M_node = (_Base_ptr)((conf->m_value).number_integer + 8);
    }
    else {
      result.m_it.primitive_iterator.m_it = 1;
    }
    result.m_object = conf;
    cVar11 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&ret,&result);
    auVar5._12_4_ = 0;
    auVar5._0_12_ = local_e8._4_12_;
    local_e8._0_16_ = auVar5 << 0x20;
    local_f8 = ZEXT816(0);
    local_12c = 0.0;
    local_68 = 0.0;
    fStack_64 = 0.0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_78 = ZEXT816(0);
    local_108 = 0.0;
    if (!(bool)cVar11) {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,0);
      vVar14 = json2vec3f(pvVar12);
      local_f8._8_4_ = extraout_XMM0_Dc_04;
      local_f8._0_8_ = vVar14._0_8_;
      local_f8._12_4_ = extraout_XMM0_Dd_04;
      local_e8._0_4_ = vVar14.z;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,1);
      vVar14 = json2vec3f(pvVar12);
      local_12c = vVar14.z;
      local_78._8_4_ = extraout_XMM0_Dc_05;
      local_78._0_8_ = vVar14._0_8_;
      local_78._12_4_ = extraout_XMM0_Dd_05;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,2);
      vVar14 = json2vec3f(pvVar12);
      local_108 = vVar14.z;
      local_68 = vVar14.x;
      fStack_64 = vVar14.y;
      uStack_60 = extraout_XMM0_Dc_06;
      uStack_5c = extraout_XMM0_Dd_06;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[4]>
              ((const_iterator *)&ret,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [4])"uvs");
    result.m_it.primitive_iterator.m_it = -0x8000000000000000;
    result.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    result.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      result.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      result.m_it.object_iterator._M_node = (_Base_ptr)((conf->m_value).number_integer + 8);
    }
    else {
      result.m_it.primitive_iterator.m_it = 1;
    }
    result.m_object = conf;
    bVar10 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&ret,&result);
    if (bVar10) {
      local_88 = ZEXT816(0);
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      local_98 = ZEXT816(0);
    }
    else {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,0);
      vVar4 = json2vec2f(pvVar12);
      local_88._8_4_ = extraout_XMM0_Dc_07;
      local_88._0_4_ = vVar4.x;
      local_88._4_4_ = vVar4.y;
      local_88._12_4_ = extraout_XMM0_Dd_07;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,1);
      vVar4 = json2vec2f(pvVar12);
      local_98._8_4_ = extraout_XMM0_Dc_08;
      local_98._0_4_ = vVar4.x;
      local_98._4_4_ = vVar4.y;
      local_98._12_4_ = extraout_XMM0_Dd_08;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar12 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar12,2);
      local_a0 = json2vec2f(pvVar12);
    }
    this = (Triangle *)operator_new(0xa0);
    auVar9 = local_38;
    auVar8 = local_48;
    auVar7 = local_58;
    auVar6 = local_78;
    auVar5 = local_f8;
    local_b0 = local_f8._0_8_;
    local_a8 = (float)local_e8._0_4_;
    local_c0 = local_78._0_8_;
    local_b8 = local_12c;
    local_d0 = CONCAT44(fStack_64,local_68);
    local_c8 = local_108;
    vVar14.z = (float)local_e8._0_4_;
    vVar14.x = (float)local_f8._0_4_;
    vVar14.y = (float)local_f8._4_4_;
    vn2.z = local_12c;
    vn2.x = (float)local_78._0_4_;
    vn2.y = (float)local_78._4_4_;
    vn3.z = local_108;
    vn3.x = local_68;
    vn3.y = fStack_64;
    v1.z = local_fc;
    v1.x = (float)local_38._0_4_;
    v1.y = (float)local_38._4_4_;
    v2.z = local_100;
    v2.x = (float)local_48._0_4_;
    v2.y = (float)local_48._4_4_;
    v3.z = local_104;
    v3.x = (float)local_58._0_4_;
    v3.y = (float)local_58._4_4_;
    local_f8 = auVar5;
    local_78 = auVar6;
    local_58 = auVar7;
    local_48 = auVar8;
    local_38 = auVar9;
    Triangle::Triangle(this,v1,v2,v3,(vec2f)local_88._0_8_,(vec2f)local_98._0_8_,local_a0,vVar14,vn2
                       ,vn3);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[18]>
              ((const_iterator *)&ret,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [18])"recompute_normals");
    result.m_it.primitive_iterator.m_it = -0x8000000000000000;
    result.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    result.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      result.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      result.m_it.object_iterator._M_node = (_Base_ptr)((conf->m_value).number_integer + 8);
    }
    else {
      result.m_it.primitive_iterator.m_it = 1;
    }
    result.m_object = conf;
    bVar10 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&ret,&result);
    if (!bVar10) {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"recompute_normals");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar12,(boolean_t *)&ret);
      cVar11 = ret._0_1_;
    }
    if (cVar11 != '\0') {
      fVar1 = (this->planeNormal).z;
      (this->vn3).z = fVar1;
      uVar2 = (this->planeNormal).x;
      uVar3 = (this->planeNormal).y;
      (this->vn3).x = (float)uVar2;
      (this->vn3).y = (float)uVar3;
      (this->vn2).x = (float)uVar2;
      (this->vn2).y = (float)uVar3;
      (this->vn2).z = fVar1;
      (this->vn1).x = (float)uVar2;
      (this->vn1).y = (float)uVar3;
      (this->vn1).z = fVar1;
    }
  }
  if (this == (Triangle *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,pvVar12)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   "Unrecognized Geometric type: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
    std::runtime_error::runtime_error(this_00,(string *)&ret);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (Primitive *)this;
}

Assistant:

Primitive* newPrimitive(const Json& conf)
{
	Primitive* shape = NULL;
	if (conf["type"] == "mesh") {
		shape = meshref[conf["file"]];
	}
	if (conf["type"] == "sphere") {
		shape = new Sphere(json2vec3f(conf["origin"]), (double)conf["radius"]);
	}
	if (conf["type"] == "plane") {
		shape = new Plane(json2vec3f(conf["normal"]), (double)conf["offset"]);
	}
	if (conf["type"] == "cube") {
		shape = new Cube();
	}
	if (conf["type"] == "quad") {
		shape = new Quad();
	}
	if (conf["type"] == "revsurface") {
		shape = new RevSurface(conf);
	}
	if (conf["type"] == "triangle") {
		vec3f v1,v2,v3,n1,n2,n3;
		bool recompute_normal = true;
		v1 = json2vec3f(conf["vertices"][0]);
		v2 = json2vec3f(conf["vertices"][1]);
		v3 = json2vec3f(conf["vertices"][2]);
		if (conf.find("normals") != conf.end()) {
			recompute_normal = false;
			n1 = json2vec3f(conf["normals"][0]);
			n2 = json2vec3f(conf["normals"][1]);
			n3 = json2vec3f(conf["normals"][2]);
		}
		vec2f t1,t2,t3;
		if (conf.find("uvs") != conf.end()) {
			t1 = json2vec2f(conf["uvs"][0]);
			t2 = json2vec2f(conf["uvs"][1]);
			t3 = json2vec2f(conf["uvs"][2]);
		}
		Triangle* tshape = new Triangle(v1,v2,v3,t1,t2,t3,n1,n2,n3);
		if (conf.find("recompute_normals") != conf.end())
			recompute_normal = conf["recompute_normals"];
		if (recompute_normal)
			tshape->recompute_normal();
		shape = tshape;
	}
	if (shape == NULL) {
		throw std::runtime_error("Unrecognized Geometric type: " + std::string(conf["type"]));
	}
	return shape;
}